

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O2

pair<BigInteger,_BigInteger> *
ext_gcd(pair<BigInteger,_BigInteger> *__return_storage_ptr__,BigInteger *a,BigInteger *b)

{
  pointer puVar1;
  pair<BigInteger,_BigInteger> *ppVar2;
  bool bVar3;
  BigInteger BStack_118;
  pair<BigInteger,_BigInteger> *local_f8;
  BigInteger alpha;
  BigInteger u;
  BigInteger t;
  BigInteger s;
  BigInteger v;
  BigInteger beta;
  
  BigInteger::BigInteger(&u,1);
  BigInteger::BigInteger(&v,0);
  BigInteger::BigInteger(&s,0);
  BigInteger::BigInteger(&t,1);
  while (((puVar1 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish == puVar1 || ((*puVar1 & 1) == 0)) &&
         ((puVar1 = (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
          (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish == puVar1 || ((*puVar1 & 1) == 0))))) {
    BigInteger::BigInteger(&alpha,2);
    BigInteger::operator/=(a,&alpha);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&alpha);
    BigInteger::BigInteger(&alpha,2);
    BigInteger::operator/=(b,&alpha);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&alpha);
  }
  BigInteger::BigInteger(&alpha,a);
  local_f8 = __return_storage_ptr__;
  BigInteger::BigInteger(&beta,b);
  while ((puVar1 = (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start,
         (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish == puVar1 || ((*puVar1 & 1) == 0))) {
    BigInteger::BigInteger(&BStack_118,2);
    BigInteger::operator/=(a,&BStack_118);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&BStack_118);
    if (((u.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          u.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) ||
        ((*u.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start & 1) == 0)) &&
       ((puVar1 = (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish == puVar1 || ((*puVar1 & 1) == 0)))) {
      BigInteger::BigInteger(&BStack_118,2);
      BigInteger::operator/=(&u,&BStack_118);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&BStack_118);
      BigInteger::BigInteger(&BStack_118,2);
      BigInteger::operator/=(&v,&BStack_118);
    }
    else {
      BigInteger::operator+=(&u,&beta);
      BigInteger::BigInteger(&BStack_118,2);
      BigInteger::operator/=(&u,&BStack_118);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&BStack_118);
      BigInteger::operator-=(&v,&alpha);
      BigInteger::BigInteger(&BStack_118,2);
      BigInteger::operator/=(&v,&BStack_118);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&BStack_118);
  }
  while( true ) {
    bVar3 = operator!=(a,b);
    ppVar2 = local_f8;
    if (!bVar3) break;
    puVar1 = (b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (((b->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish == puVar1) || ((*puVar1 & 1) == 0)) {
      BigInteger::BigInteger(&BStack_118,2);
      BigInteger::operator/=(b,&BStack_118);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&BStack_118);
      if (((s.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            s.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) ||
          ((*s.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start & 1) == 0)) &&
         ((t.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           t.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start ||
          ((*t.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start & 1) == 0)))) {
        BigInteger::BigInteger(&BStack_118,2);
        BigInteger::operator/=(&s,&BStack_118);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&BStack_118);
        BigInteger::BigInteger(&BStack_118,2);
        BigInteger::operator/=(&t,&BStack_118);
      }
      else {
        BigInteger::operator+=(&s,&beta);
        BigInteger::BigInteger(&BStack_118,2);
        BigInteger::operator/=(&s,&BStack_118);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&BStack_118);
        BigInteger::operator-=(&t,&alpha);
        BigInteger::BigInteger(&BStack_118,2);
        BigInteger::operator/=(&t,&BStack_118);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&BStack_118);
    }
    else {
      bVar3 = operator<(b,a);
      if (bVar3) {
        BigInteger::swap(a,b);
        BigInteger::swap(&u,&s);
        BigInteger::swap(&v,&t);
      }
      else {
        BigInteger::operator-=(b,a);
        BigInteger::operator-=(&s,&u);
        BigInteger::operator-=(&t,&v);
      }
    }
  }
  std::pair<BigInteger,_BigInteger>::pair<BigInteger_&,_BigInteger_&,_true>(local_f8,&s,&t);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&beta);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&alpha);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&t);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&s);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&v);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&u);
  return ppVar2;
}

Assistant:

std::pair<BigInteger, BigInteger> ext_gcd(BigInteger a, BigInteger b)
{
    BigInteger u = 1, v = 0, s = 0, t = 1;
    while(!a.odd() && !b.odd())
    {
        a /= 2;
        b /= 2;
    }
    BigInteger alpha = a, beta = b;
    while(!a.odd())
    {
        a /= 2;
        if(!u.odd() && !b.odd())
        {
            u /= 2;
            v /= 2;
        }
        else
        {
            u += beta;
            u /= 2;
            v -= alpha;
            v /= 2;
        }
    }
    while(a != b)
    {
        if(!b.odd())
        {
            b /= 2;
            if(!s.odd() && !t.odd())
            {
                s /= 2;
                t /= 2;
            }
            else
            {
                s += beta;
                s /= 2;
                t -= alpha;
                t /= 2;
            }
        }
        else if(b < a)
        {
            a.swap(b);
            u.swap(s);
            v.swap(t);
        }
        else
        {
            b -= a;
            s -= u;
            t -= v;
        }
    }
    return {s, t};
}